

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_update_inter_mode_stats
               (FRAME_CONTEXT *fc,FRAME_COUNTS *counts,PREDICTION_MODE mode,int16_t mode_context)

{
  short sVar1;
  aom_cdf_prob (*paaVar2) [3];
  ushort uVar3;
  byte bVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  ushort uVar6;
  aom_cdf_prob (*paaVar7) [3];
  ushort uVar8;
  
  uVar5 = (ushort)mode_context & 7;
  paaVar7 = fc->newmv_cdf + uVar5;
  uVar6 = fc->newmv_cdf[uVar5][2];
  bVar4 = (char)(uVar6 >> 4) + 4;
  uVar8 = (*paaVar7)[0];
  if ((int)CONCAT71(in_register_00000011,mode) == 0x10) {
    uVar3 = uVar8 >> (bVar4 & 0x1f);
    paaVar2 = fc->newmv_cdf + uVar5;
  }
  else {
    (*paaVar7)[0] = (short)((int)(0x8000 - (uint)uVar8) >> (bVar4 & 0x1f)) + uVar8;
    fc->newmv_cdf[uVar5][2] = uVar6 + (uVar6 < 0x20);
    uVar5 = (ushort)mode_context >> 3 & 1;
    paaVar7 = fc->zeromv_cdf + uVar5;
    uVar6 = fc->zeromv_cdf[uVar5][2];
    bVar4 = (char)(uVar6 >> 4) + 4;
    uVar8 = (*paaVar7)[0];
    if (mode != '\x0f') {
      (*paaVar7)[0] = (short)((int)(0x8000 - (uint)uVar8) >> (bVar4 & 0x1f)) + uVar8;
      fc->zeromv_cdf[uVar5][2] = uVar6 + (uVar6 < 0x20);
      uVar5 = (ushort)mode_context >> 4 & 0xf;
      uVar6 = fc->refmv_cdf[uVar5][2];
      bVar4 = (char)(uVar6 >> 4) + 4;
      uVar8 = fc->refmv_cdf[uVar5][0];
      if (mode == '\r') {
        sVar1 = -(uVar8 >> (bVar4 & 0x1f));
      }
      else {
        sVar1 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar4 & 0x1f));
      }
      paaVar2 = fc->refmv_cdf + uVar5;
      fc->refmv_cdf[uVar5][0] = uVar8 + sVar1;
      goto LAB_001ac566;
    }
    uVar3 = uVar8 >> (bVar4 & 0x1f);
    paaVar2 = fc->zeromv_cdf + uVar5;
  }
  (*paaVar7)[0] = uVar8 - uVar3;
LAB_001ac566:
  (*paaVar2)[2] = uVar6 + (uVar6 < 0x20);
  return;
}

Assistant:

void av1_update_inter_mode_stats(FRAME_CONTEXT *fc, FRAME_COUNTS *counts,
                                 PREDICTION_MODE mode, int16_t mode_context) {
  (void)counts;

  int16_t mode_ctx = mode_context & NEWMV_CTX_MASK;
  if (mode == NEWMV) {
#if CONFIG_ENTROPY_STATS
    ++counts->newmv_mode[mode_ctx][0];
#endif
    update_cdf(fc->newmv_cdf[mode_ctx], 0, 2);
    return;
  }

#if CONFIG_ENTROPY_STATS
  ++counts->newmv_mode[mode_ctx][1];
#endif
  update_cdf(fc->newmv_cdf[mode_ctx], 1, 2);

  mode_ctx = (mode_context >> GLOBALMV_OFFSET) & GLOBALMV_CTX_MASK;
  if (mode == GLOBALMV) {
#if CONFIG_ENTROPY_STATS
    ++counts->zeromv_mode[mode_ctx][0];
#endif
    update_cdf(fc->zeromv_cdf[mode_ctx], 0, 2);
    return;
  }

#if CONFIG_ENTROPY_STATS
  ++counts->zeromv_mode[mode_ctx][1];
#endif
  update_cdf(fc->zeromv_cdf[mode_ctx], 1, 2);

  mode_ctx = (mode_context >> REFMV_OFFSET) & REFMV_CTX_MASK;
#if CONFIG_ENTROPY_STATS
  ++counts->refmv_mode[mode_ctx][mode != NEARESTMV];
#endif
  update_cdf(fc->refmv_cdf[mode_ctx], mode != NEARESTMV, 2);
}